

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase888::run(TestCase888 *this)

{
  TestInterfaceImpl *pTVar1;
  TestInterfaceImpl *pTVar2;
  __pid_t _Var3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TransformPromiseNodeBase *pTVar4;
  byte bVar5;
  char *in_RCX;
  undefined7 uVar6;
  char *params;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface> set1;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface> set2;
  bool resolved3;
  bool resolved2;
  bool resolved1;
  Own<kj::_::PromiseNode> local_330;
  Own<kj::_::PromiseNode> local_320;
  WaitScope waitScope;
  int callCount;
  Own<kj::_::PromiseNode> local_2f8;
  Own<capnp::_::TestInterfaceImpl> ownServer2;
  Own<capnp::_::TestInterfaceImpl> ownServer1;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:935:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise3;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:930:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:925:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise1;
  Client client1;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> paf;
  undefined1 local_260 [344];
  Client client2;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> errorPaf;
  Client clientPromise;
  Array<char> local_b8;
  Client errorPromise;
  Client clientNull;
  Client clientStandalone;
  EventLoop loop;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  callCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_260,&callCount);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&clientStandalone,(Own<capnp::_::TestInterfaceImpl> *)local_260);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)local_260);
  capnproto_test::capnp::test::TestInterface::Client::Client(&clientNull,(void *)0x0);
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&ownServer1,&callCount);
  pTVar2 = ownServer1.ptr;
  local_260._0_8_ = ownServer1.disposer;
  local_260._8_8_ = ownServer1.ptr;
  ownServer1.ptr = (TestInterfaceImpl *)0x0;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::add
            (&client1,&set1,(Own<capnproto_test::capnp::test::TestInterface::Server> *)local_260);
  kj::Own<capnproto_test::capnp::test::TestInterface::Server>::dispose
            ((Own<capnproto_test::capnp::test::TestInterface::Server> *)local_260);
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&ownServer2,&callCount);
  pTVar1 = ownServer2.ptr;
  local_260._0_8_ = ownServer2.disposer;
  local_260._8_8_ = ownServer2.ptr;
  ownServer2.ptr = (TestInterfaceImpl *)0x0;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::add
            (&client2,&set2,(Own<capnproto_test::capnp::test::TestInterface::Server> *)local_260);
  kj::Own<capnproto_test::capnp::test::TestInterface::Server>::dispose
            ((Own<capnproto_test::capnp::test::TestInterface::Server> *)local_260);
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
             (Client *)&set1);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     local_260,&waitScope);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
  if ((TestInterfaceImpl *)CONCAT44(extraout_var,_Var3) == (TestInterfaceImpl *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)local_260,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x38b,FAILED,"set1.getLocalServer(client1).wait(waitScope) != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)local_260);
  }
  if ((pTVar2 != (TestInterfaceImpl *)CONCAT44(extraout_var,_Var3)) &&
     (kj::_::Debug::minSeverity < 3)) {
    paf.promise.super_PromiseBase.node.disposer = (Disposer *)pTVar2;
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
               (Client *)&set1);
    _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       local_260,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    if ((Disposer *)CONCAT44(extraout_var_00,_Var3) == (Disposer *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)local_260,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38b,FAILED,"set1.getLocalServer(client1).wait(waitScope) != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)local_260);
    }
    in_RCX = 
    "\"failed: expected \" \"(&server1) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 907, ::kj::Exception::Type::FAILED, \\\"set1.getLocalServer(client1).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server1, &(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 907, ::kj::Exception::Type::FAILED, \"set1.getLocalServer(client1).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
    ;
    errorPaf.promise.super_PromiseBase.node.disposer = (Disposer *)CONCAT44(extraout_var_00,_Var3);
    kj::_::Debug::
    log<char_const(&)[442],capnp::_::TestInterfaceImpl*,capnproto_test::capnp::test::TestInterface::Server*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x38b,ERROR,
               "\"failed: expected \" \"(&server1) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 907, ::kj::Exception::Type::FAILED, \\\"set1.getLocalServer(client1).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server1, &(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 907, ::kj::Exception::Type::FAILED, \"set1.getLocalServer(client1).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [442])
                "failed: expected (&server1) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 907, ::kj::Exception::Type::FAILED, \"set1.getLocalServer(client1).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(TestInterfaceImpl **)&paf,(Server **)&errorPaf);
  }
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
             (Client *)&set2);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     local_260,&waitScope);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
  if ((TestInterfaceImpl *)CONCAT44(extraout_var_01,_Var3) != (TestInterfaceImpl *)0x0) {
    if ((pTVar1 != (TestInterfaceImpl *)CONCAT44(extraout_var_01,_Var3)) &&
       (kj::_::Debug::minSeverity < 3)) {
      paf.promise.super_PromiseBase.node.disposer = (Disposer *)pTVar1;
      CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
                ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
                 (Client *)&set2);
      _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                        ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
                          *)local_260,&waitScope);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
      if ((Disposer *)CONCAT44(extraout_var_02,_Var3) == (Disposer *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)local_260,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x38c,FAILED,"set2.getLocalServer(client2).wait(waitScope) != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)local_260);
      }
      in_RCX = 
      "\"failed: expected \" \"(&server2) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 908, ::kj::Exception::Type::FAILED, \\\"set2.getLocalServer(client2).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server2, &(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 908, ::kj::Exception::Type::FAILED, \"set2.getLocalServer(client2).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
      ;
      errorPaf.promise.super_PromiseBase.node.disposer = (Disposer *)CONCAT44(extraout_var_02,_Var3)
      ;
      kj::_::Debug::
      log<char_const(&)[442],capnp::_::TestInterfaceImpl*,capnproto_test::capnp::test::TestInterface::Server*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38c,ERROR,
                 "\"failed: expected \" \"(&server2) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 908, ::kj::Exception::Type::FAILED, \\\"set2.getLocalServer(client2).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server2, &(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 908, ::kj::Exception::Type::FAILED, \"set2.getLocalServer(client2).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [442])
                  "failed: expected (&server2) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 908, ::kj::Exception::Type::FAILED, \"set2.getLocalServer(client2).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(TestInterfaceImpl **)&paf,(Server **)&errorPaf);
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
               (Client *)&set1);
    _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       local_260,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    if ((CONCAT44(extraout_var_03,_Var3) != 0) && (kj::_::Debug::minSeverity < 3)) {
      in_RCX = "\"failed: expected \" \"set1.getLocalServer(client2).wait(waitScope) == nullptr\"";
      kj::_::Debug::log<char_const(&)[73]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38f,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(client2).wait(waitScope) == nullptr\""
                 ,(char (*) [73])
                  "failed: expected set1.getLocalServer(client2).wait(waitScope) == nullptr");
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
               (Client *)&set2);
    _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       local_260,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    if ((CONCAT44(extraout_var_04,_Var3) != 0) && (kj::_::Debug::minSeverity < 3)) {
      in_RCX = "\"failed: expected \" \"set2.getLocalServer(client1).wait(waitScope) == nullptr\"";
      kj::_::Debug::log<char_const(&)[73]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x390,ERROR,
                 "\"failed: expected \" \"set2.getLocalServer(client1).wait(waitScope) == nullptr\""
                 ,(char (*) [73])
                  "failed: expected set2.getLocalServer(client1).wait(waitScope) == nullptr");
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
               (Client *)&set1);
    _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       local_260,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    if ((CONCAT44(extraout_var_05,_Var3) != 0) && (kj::_::Debug::minSeverity < 3)) {
      in_RCX = 
      "\"failed: expected \" \"set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr\"";
      kj::_::Debug::log<char_const(&)[82]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x391,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr\""
                 ,(char (*) [82])
                  "failed: expected set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr"
                );
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_260,
               (Client *)&set1);
    _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       local_260,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    if ((CONCAT44(extraout_var_06,_Var3) != 0) && (kj::_::Debug::minSeverity < 3)) {
      in_RCX = 
      "\"failed: expected \" \"set1.getLocalServer(clientNull).wait(waitScope) == nullptr\"";
      kj::_::Debug::log<char_const(&)[76]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x392,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(clientNull).wait(waitScope) == nullptr\""
                 ,(char (*) [76])
                  "failed: expected set1.getLocalServer(clientNull).wait(waitScope) == nullptr");
    }
    kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestInterface::Client>();
    capnproto_test::capnp::test::TestInterface::Client::
    Client<capnproto_test::capnp::test::TestInterface::Client,void>(&clientPromise,&paf.promise);
    kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestInterface::Client>();
    capnproto_test::capnp::test::TestInterface::Client::
    Client<capnproto_test::capnp::test::TestInterface::Client,void>(&errorPromise,&errorPaf.promise)
    ;
    resolved1 = false;
    resolved2 = false;
    resolved3 = false;
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_330,
               (Client *)&set1);
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x38);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_330,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:925:13),_kj::_::PropagateException>
               ::anon_class_16_2_d9e2555e_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657c20;
    pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&resolved1;
    pTVar4[1].dependency.disposer = (Disposer *)pTVar2;
    local_260._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_0,kj::_::PropagateException>>
          ::instance;
    local_2f8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_0,kj::_::PropagateException>>
          ::instance;
    local_260._8_8_ = (TestInterfaceImpl *)0x0;
    promise1.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_0,kj::_::PropagateException>>
          ::instance;
    local_2f8.ptr = (PromiseNode *)0x0;
    promise1.super_PromiseBase.node.ptr = (PromiseNode *)pTVar4;
    kj::Own<kj::_::PromiseNode>::dispose(&local_2f8);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    kj::Own<kj::_::PromiseNode>::dispose(&local_330);
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_330,
               (Client *)&set2);
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_330,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:930:13),_kj::_::PropagateException>
               ::anon_class_8_1_9ee849da_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657ca8;
    pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&resolved2;
    local_260._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_1,kj::_::PropagateException>>
          ::instance;
    local_2f8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_1,kj::_::PropagateException>>
          ::instance;
    local_260._8_8_ = (TestInterfaceImpl *)0x0;
    promise2.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_1,kj::_::PropagateException>>
          ::instance;
    local_2f8.ptr = (PromiseNode *)0x0;
    promise2.super_PromiseBase.node.ptr = (PromiseNode *)pTVar4;
    kj::Own<kj::_::PromiseNode>::dispose(&local_2f8);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    kj::Own<kj::_::PromiseNode>::dispose(&local_330);
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_330,
               (Client *)&set1);
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_330,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:935:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:937:6)>
               ::anon_class_1_0_00000001_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657d30;
    pTVar4[1].dependency.disposer = (Disposer *)&resolved3;
    local_260._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_2,capnp::_::(anonymous_namespace)::TestCase888::run()::$_3>>
          ::instance;
    local_2f8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_2,capnp::_::(anonymous_namespace)::TestCase888::run()::$_3>>
          ::instance;
    local_260._8_8_ = (TestInterfaceImpl *)0x0;
    promise3.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_2,capnp::_::(anonymous_namespace)::TestCase888::run()::$_3>>
          ::instance;
    local_2f8.ptr = (PromiseNode *)0x0;
    promise3.super_PromiseBase.node.ptr = (PromiseNode *)pTVar4;
    kj::Own<kj::_::PromiseNode>::dispose(&local_2f8);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    kj::Own<kj::_::PromiseNode>::dispose(&local_330);
    kj::_::yield();
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_330,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:942:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657db8;
    local_260._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_4,kj::_::PropagateException>>
          ::instance;
    local_2f8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_4,kj::_::PropagateException>>
          ::instance;
    local_260._8_8_ = (TestInterfaceImpl *)0x0;
    local_320.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_4,kj::_::PropagateException>>
          ::instance;
    local_2f8.ptr = (PromiseNode *)0x0;
    local_320.ptr = (PromiseNode *)pTVar4;
    kj::Own<kj::_::PromiseNode>::dispose(&local_2f8);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    kj::Own<kj::_::PromiseNode>::dispose(&local_330);
    kj::Promise<void>::wait((Promise<void> *)&local_320,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose(&local_320);
    kj::_::yield();
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_330,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:943:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657e40;
    local_260._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_5,kj::_::PropagateException>>
          ::instance;
    local_2f8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_5,kj::_::PropagateException>>
          ::instance;
    local_260._8_8_ = (TestInterfaceImpl *)0x0;
    local_320.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_5,kj::_::PropagateException>>
          ::instance;
    local_2f8.ptr = (PromiseNode *)0x0;
    local_320.ptr = (PromiseNode *)pTVar4;
    kj::Own<kj::_::PromiseNode>::dispose(&local_2f8);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    kj::Own<kj::_::PromiseNode>::dispose(&local_330);
    kj::Promise<void>::wait((Promise<void> *)&local_320,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose(&local_320);
    kj::_::yield();
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_330,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:944:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657ec8;
    local_260._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_6,kj::_::PropagateException>>
          ::instance;
    local_2f8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_6,kj::_::PropagateException>>
          ::instance;
    local_260._8_8_ = (TestInterfaceImpl *)0x0;
    local_320.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_6,kj::_::PropagateException>>
          ::instance;
    local_2f8.ptr = (PromiseNode *)0x0;
    local_320.ptr = (PromiseNode *)pTVar4;
    kj::Own<kj::_::PromiseNode>::dispose(&local_2f8);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    kj::Own<kj::_::PromiseNode>::dispose(&local_330);
    kj::Promise<void>::wait((Promise<void> *)&local_320,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose(&local_320);
    kj::_::yield();
    pTVar4 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar4,&local_330,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:945:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657f50;
    local_260._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_7,kj::_::PropagateException>>
          ::instance;
    local_2f8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_7,kj::_::PropagateException>>
          ::instance;
    local_260._8_8_ = (TestInterfaceImpl *)0x0;
    local_320.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_7,kj::_::PropagateException>>
          ::instance;
    local_2f8.ptr = (PromiseNode *)0x0;
    local_320.ptr = (PromiseNode *)pTVar4;
    kj::Own<kj::_::PromiseNode>::dispose(&local_2f8);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_260);
    kj::Own<kj::_::PromiseNode>::dispose(&local_330);
    kj::Promise<void>::wait((Promise<void> *)&local_320,&waitScope);
    kj::Own<kj::_::PromiseNode>::dispose(&local_320);
    uVar6 = (undefined7)((ulong)in_RCX >> 8);
    if ((resolved1 & kj::_::Debug::minSeverity < 3) != 0) {
      uVar6 = 0x4ca9;
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b3,ERROR,"\"failed: expected \" \"!(resolved1)\"",
                 (char (*) [30])"failed: expected !(resolved1)");
    }
    bVar5 = kj::_::Debug::minSeverity < 3 & resolved2;
    params = (char *)CONCAT71(uVar6,bVar5);
    if (bVar5 == 1) {
      params = "\"failed: expected \" \"!(resolved2)\"";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b4,ERROR,"\"failed: expected \" \"!(resolved2)\"",
                 (char (*) [30])"failed: expected !(resolved2)");
    }
    if ((resolved3 == true) && (kj::_::Debug::minSeverity < 3)) {
      params = "\"failed: expected \" \"!(resolved3)\"";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b5,ERROR,"\"failed: expected \" \"!(resolved3)\"",
                 (char (*) [30])"failed: expected !(resolved3)");
    }
    kj::cp<capnproto_test::capnp::test::TestInterface::Client>((Client *)local_260,&client1);
    (**(paf.fulfiller.ptr)->_vptr_PromiseFulfiller)(paf.fulfiller.ptr,(Client *)local_260);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_260 + 8));
    kj::_::Debug::makeDescription<char_const(&)[4]>
              ((String *)&local_b8,(Debug *)"\"foo\"","foo",(char (*) [4])params);
    kj::Exception::Exception
              ((Exception *)local_260,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3b8,(String *)&local_b8);
    (*(errorPaf.fulfiller.ptr)->_vptr_PromiseFulfiller[1])
              (errorPaf.fulfiller.ptr,(Exception *)local_260);
    kj::Exception::~Exception((Exception *)local_260);
    kj::Array<char>::~Array(&local_b8);
    kj::Promise<void>::wait(&promise1,&waitScope);
    kj::Promise<void>::wait(&promise2,&waitScope);
    kj::Promise<void>::wait(&promise3,&waitScope);
    if (kj::_::Debug::minSeverity < 3 && resolved1 == false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3be,ERROR,"\"failed: expected \" \"resolved1\"",
                 (char (*) [27])"failed: expected resolved1");
    }
    if (kj::_::Debug::minSeverity < 3 && resolved2 == false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3bf,ERROR,"\"failed: expected \" \"resolved2\"",
                 (char (*) [27])"failed: expected resolved2");
    }
    if ((resolved3 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3c0,ERROR,"\"failed: expected \" \"resolved3\"",
                 (char (*) [27])"failed: expected resolved3");
    }
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise3);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise2);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise1);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&errorPromise.field_0x8);
    kj::PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client>::
    ~PromiseFulfillerPair(&errorPaf);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&clientPromise.field_0x8);
    kj::PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client>::
    ~PromiseFulfillerPair(&paf);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client2.field_0x8);
    kj::Own<capnp::_::TestInterfaceImpl>::dispose(&ownServer2);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client1.field_0x8);
    kj::Own<capnp::_::TestInterfaceImpl>::dispose(&ownServer1);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&clientNull.field_0x8);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&clientStandalone.field_0x8);
    kj::WaitScope::~WaitScope(&waitScope);
    kj::EventLoop::~EventLoop(&loop);
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)local_260,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x38c,FAILED,"set2.getLocalServer(client2).wait(waitScope) != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)local_260);
}

Assistant:

TEST(Capability, CapabilityServerSet) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  CapabilityServerSet<test::TestInterface> set1, set2;

  int callCount = 0;
  test::TestInterface::Client clientStandalone(kj::heap<TestInterfaceImpl>(callCount));
  test::TestInterface::Client clientNull = nullptr;

  auto ownServer1 = kj::heap<TestInterfaceImpl>(callCount);
  auto& server1 = *ownServer1;
  test::TestInterface::Client client1 = set1.add(kj::mv(ownServer1));

  auto ownServer2 = kj::heap<TestInterfaceImpl>(callCount);
  auto& server2 = *ownServer2;
  test::TestInterface::Client client2 = set2.add(kj::mv(ownServer2));

  // Getting the local server using the correct set works.
  EXPECT_EQ(&server1, &KJ_ASSERT_NONNULL(set1.getLocalServer(client1).wait(waitScope)));
  EXPECT_EQ(&server2, &KJ_ASSERT_NONNULL(set2.getLocalServer(client2).wait(waitScope)));

  // Getting the local server using the wrong set doesn't work.
  EXPECT_TRUE(set1.getLocalServer(client2).wait(waitScope) == nullptr);
  EXPECT_TRUE(set2.getLocalServer(client1).wait(waitScope) == nullptr);
  EXPECT_TRUE(set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr);
  EXPECT_TRUE(set1.getLocalServer(clientNull).wait(waitScope) == nullptr);

  // A promise client waits to be resolved.
  auto paf = kj::newPromiseAndFulfiller<test::TestInterface::Client>();
  test::TestInterface::Client clientPromise = kj::mv(paf.promise);

  auto errorPaf = kj::newPromiseAndFulfiller<test::TestInterface::Client>();
  test::TestInterface::Client errorPromise = kj::mv(errorPaf.promise);

  bool resolved1 = false, resolved2 = false, resolved3 = false;
  auto promise1 = set1.getLocalServer(clientPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    resolved1 = true;
    EXPECT_EQ(&server1, &KJ_ASSERT_NONNULL(server));
  });
  auto promise2 = set2.getLocalServer(clientPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    resolved2 = true;
    EXPECT_TRUE(server == nullptr);
  });
  auto promise3 = set1.getLocalServer(errorPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    KJ_FAIL_EXPECT("getLocalServer() on error promise should have thrown");
  }, [&](kj::Exception&& e) {
    resolved3 = true;
    KJ_EXPECT(e.getDescription().endsWith("foo"), e.getDescription());
  });

  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);

  EXPECT_FALSE(resolved1);
  EXPECT_FALSE(resolved2);
  EXPECT_FALSE(resolved3);

  paf.fulfiller->fulfill(kj::cp(client1));
  errorPaf.fulfiller->reject(KJ_EXCEPTION(FAILED, "foo"));

  promise1.wait(waitScope);
  promise2.wait(waitScope);
  promise3.wait(waitScope);

  EXPECT_TRUE(resolved1);
  EXPECT_TRUE(resolved2);
  EXPECT_TRUE(resolved3);
}